

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int lua_resume(lua_State *L,lua_State *from,int nargs)

{
  CallInfo *pCVar1;
  ushort uVar2;
  int errcode;
  CallInfo **ppCVar3;
  char *msg;
  StkId level;
  unsigned_short uVar4;
  CallInfo **ppCVar5;
  int status;
  unsigned_short local_3e;
  int nargs_local;
  CallInfo **local_38;
  
  uVar4 = L->nny;
  nargs_local = nargs;
  if (L->status == '\x01') {
LAB_00108ac1:
    if (from == (lua_State *)0x0) {
      L->nCcalls = 1;
    }
    else {
      uVar2 = from->nCcalls + 1;
      L->nCcalls = uVar2;
      if (199 < uVar2) {
        msg = "C stack overflow";
        goto LAB_00108aec;
      }
    }
    L->nny = 0;
    errcode = luaD_rawrunprotected(L,resume,&nargs_local);
    if (errcode == -1) {
      status = 2;
    }
    else {
      ppCVar3 = &L->ci;
      while (ppCVar5 = ppCVar3, status = errcode, 1 < errcode) {
        while( true ) {
          pCVar1 = *ppCVar5;
          if (pCVar1 == (CallInfo *)0x0) {
            if (1 < errcode) {
              L->status = (lu_byte)errcode;
              seterrorobj(L,errcode,L->top);
              L->ci->top = L->top;
            }
            goto LAB_00108c17;
          }
          if ((pCVar1->callstatus & 0x10) != 0) break;
          ppCVar5 = &pCVar1->previous;
        }
        level = (StkId)((long)&L->stack->value_ + pCVar1->extra);
        local_3e = uVar4;
        local_38 = ppCVar3;
        luaF_close(L,level);
        uVar4 = local_3e;
        seterrorobj(L,errcode,level);
        L->ci = pCVar1;
        L->allowhook = (byte)pCVar1->callstatus & 1;
        L->nny = 0;
        luaD_shrinkstack(L);
        L->errfunc = (ptrdiff_t)(pCVar1->u).l.savedpc;
        errcode = luaD_rawrunprotected(L,unroll,&status);
        ppCVar3 = local_38;
      }
    }
LAB_00108c17:
    L->nny = uVar4;
    L->nCcalls = L->nCcalls - 1;
  }
  else {
    if (L->status == '\0') {
      if (L->ci == &L->base_ci) goto LAB_00108ac1;
      msg = "cannot resume non-suspended coroutine";
    }
    else {
      msg = "cannot resume dead coroutine";
    }
LAB_00108aec:
    resume_error(L,msg,nargs);
    status = 2;
  }
  return status;
}

Assistant:

LUA_API int lua_resume (lua_State *L, lua_State *from, int nargs) {
  int status;
  unsigned short oldnny = L->nny;  /* save "number of non-yieldable" calls */
  lua_lock(L);
  if (L->status == LUA_OK) {  /* may be starting a coroutine */
    if (L->ci != &L->base_ci)  /* not in base level? */
      return resume_error(L, "cannot resume non-suspended coroutine", nargs);
  }
  else if (L->status != LUA_YIELD)
    return resume_error(L, "cannot resume dead coroutine", nargs);
  L->nCcalls = (from) ? from->nCcalls + 1 : 1;
  if (L->nCcalls >= LUAI_MAXCCALLS)
    return resume_error(L, "C stack overflow", nargs);
  luai_userstateresume(L, nargs);
  L->nny = 0;  /* allow yields */
  api_checknelems(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
  status = luaD_rawrunprotected(L, resume, &nargs);
  if (status == -1)  /* error calling 'lua_resume'? */
    status = LUA_ERRRUN;
  else {  /* continue running after recoverable errors */
    while (errorstatus(status) && recover(L, status)) {
      /* unroll continuation */
      status = luaD_rawrunprotected(L, unroll, &status);
    }
    if (errorstatus(status)) {  /* unrecoverable error? */
      L->status = cast_byte(status);  /* mark thread as 'dead' */
      seterrorobj(L, status, L->top);  /* push error message */
      L->ci->top = L->top;
    }
    else lua_assert(status == L->status);  /* normal end or yield */
  }
  L->nny = oldnny;  /* restore 'nny' */
  L->nCcalls--;
  lua_assert(L->nCcalls == ((from) ? from->nCcalls : 0));
  lua_unlock(L);
  return status;
}